

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,uchar c)

{
  uint uVar1;
  uchar *puVar2;
  CBStringException *pCVar3;
  CBStringException bstr__cppwrapper_exception;
  string local_80;
  string local_60;
  CBStringException local_40;
  
  uVar1 = (this->super_tagbstring).mlen;
  if ((int)uVar1 < 1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"CBString::Write protection error","");
    CBStringException::CBStringException(&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&local_40);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (uVar1 < 3) {
    alloc(this,2);
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 != (uchar *)0x0) {
    (this->super_tagbstring).slen = 1;
    *puVar2 = c;
    (this->super_tagbstring).data[1] = '\0';
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CBString::Failure in =(char) operator","");
  CBStringException::CBStringException(&local_40,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&local_40);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (unsigned char c) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (2 >= mlen) alloc (2);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(char) operator");
	} else {
		slen = 1;
		data[0] = c;
		data[1] = '\0';
	}
	return *this;
}